

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_make_procedure_op
               (sexp ctx,sexp self,sexp_sint_t n,sexp flags,sexp num_args,sexp bc,sexp vars)

{
  sexp psVar1;
  
  psVar1 = sexp_alloc_tagged_aux(ctx,0x20,0x14);
  (psVar1->value).flonum_bits[0x10] = (char)flags;
  (psVar1->value).procedure.num_args = (sexp_proc_num_args_t)((ulong)num_args >> 1);
  (psVar1->value).type.name = bc;
  (psVar1->value).type.cpl = vars;
  return psVar1;
}

Assistant:

sexp sexp_make_procedure_op (sexp ctx, sexp self, sexp_sint_t n, sexp flags,
                             sexp num_args, sexp bc, sexp vars) {
  sexp proc = sexp_alloc_type(ctx, procedure, SEXP_PROCEDURE);
  sexp_procedure_flags(proc) = (char) (sexp_uint_t) flags;
  sexp_procedure_num_args(proc) = sexp_unbox_fixnum(num_args);
  sexp_procedure_code(proc) = bc;
  sexp_procedure_vars(proc) = vars;
  return proc;
}